

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

void __thiscall Qentem::Array<Qentem::Tags::IfTagCase>::~Array(Array<Qentem::Tags::IfTagCase> *this)

{
  IfTagCase *pIVar1;
  IfTagCase *this_00;
  
  this_00 = this->storage_;
  if ((ulong)this->index_ != 0) {
    pIVar1 = this_00 + this->index_;
    do {
      if (this_00 != (IfTagCase *)0x0) {
        Array<Qentem::Tags::TagBit>::~Array(&this_00->SubTags);
        Array<Qentem::QExpression>::~Array(&this_00->Case);
      }
      this_00 = this_00 + 1;
    } while (this_00 < pIVar1);
    this_00 = this->storage_;
  }
  if (this_00 != (IfTagCase *)0x0) {
    MemoryRecord::RemoveAllocation(this_00);
  }
  operator_delete(this_00);
  return;
}

Assistant:

inline Type_T *Storage() const noexcept {
        return storage_;
    }